

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnImportTable
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  string local_50;
  
  Type::GetName_abi_cxx11_(&local_50,&elem_type);
  PrintDetails(this," - table[%u] type=%s initial=%ld",(ulong)table_index,local_50._M_dataplus._M_p,
               elem_limits->initial);
  std::__cxx11::string::_M_dispose();
  if (elem_limits->has_max == true) {
    PrintDetails(this," max=%ld",elem_limits->max);
  }
  if (elem_limits->is_64 == true) {
    PrintDetails(this," i64");
  }
  PrintDetails(this," <- %.*s.%.*s\n",module_name._M_len & 0xffffffff,module_name._M_str,
               field_name._M_len,field_name._M_str);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnImportTable(Index import_index,
                                          std::string_view module_name,
                                          std::string_view field_name,
                                          Index table_index,
                                          Type elem_type,
                                          const Limits* elem_limits) {
  PrintDetails(" - table[%" PRIindex "] type=%s initial=%" PRId64, table_index,
               elem_type.GetName().c_str(), elem_limits->initial);
  if (elem_limits->has_max) {
    PrintDetails(" max=%" PRId64, elem_limits->max);
  }
  if (elem_limits->is_64) {
    PrintDetails(" i64");
  }
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}